

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateMetadataFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int iVar1;
  undefined4 extraout_var;
  string local_110;
  string fullname;
  string filename;
  Printer printer;
  ZeroCopyOutputStream *output;
  
  GeneratedMetadataFileName(&filename,*(string **)file,is_descriptor);
  iVar1 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1);
  io::Printer::Printer(&printer,output,'^');
  GenerateHead(file,&printer);
  FilenameToClassname(&fullname,&filename);
  iVar1 = std::__cxx11::string::find_last_of((char *)&fullname,0x3430b6);
  std::__cxx11::string::substr((ulong)&local_110,(ulong)&fullname);
  io::Printer::Print(&printer,"namespace ^name^;\n\n","name",&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (iVar1 == -1) {
    io::Printer::Print(&printer,"class ^name^\n{\n","name",&fullname);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_110,(ulong)&fullname);
    io::Printer::Print(&printer,"class ^name^\n{\n","name",&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  Indent(&printer);
  GenerateAddFileToPool(file,is_descriptor,&printer);
  Outdent(&printer);
  io::Printer::Print(&printer,"}\n\n");
  std::__cxx11::string::~string((string *)&fullname);
  io::Printer::~Printer(&printer);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void GenerateMetadataFile(const FileDescriptor* file,
                          bool is_descriptor,
                          GeneratorContext* generator_context) {
  std::string filename = GeneratedMetadataFileName(file->name(), is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  printer.Print(
      "namespace ^name^;\n\n",
      "name", fullname.substr(0, lastindex));

  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  GenerateAddFileToPool(file, is_descriptor, &printer);

  Outdent(&printer);
  printer.Print("}\n\n");
}